

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

string * __thiscall pbrt::Token::ToString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  char *in_RCX;
  FileLoc *in_R8;
  string_view s;
  string sStack_38;
  
  s._M_str = in_RCX;
  s._M_len = (size_t)(this->token)._M_str;
  toString_abi_cxx11_(&sStack_38,(pbrt *)(this->token)._M_len,s);
  StringPrintf<std::__cxx11::string,pbrt::FileLoc_const&>
            (__return_storage_ptr__,(pbrt *)"[ Token token: %s loc: %s ]",(char *)&sStack_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->loc,in_R8);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::ToString() const {
    return StringPrintf("[ Token token: %s loc: %s ]", toString(token), loc);
}